

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O2

char * __thiscall
google::protobuf::MessageOptions::_InternalParse(MessageOptions *this,char *ptr,ParseContext *ctx)

{
  bool bVar1;
  UninterpretedOption *msg;
  uint64 uVar2;
  char cVar3;
  uint uVar4;
  uint32 tag;
  char *local_50;
  uint local_44;
  InternalMetadataWithArena *local_40;
  ExtensionSet *local_38;
  
  local_40 = &this->_internal_metadata_;
  local_38 = &this->_extensions_;
  uVar4 = 0;
  local_50 = ptr;
LAB_002bcf14:
  do {
    bVar1 = internal::ParseContext::Done(ctx,&local_50);
    if (bVar1) goto LAB_002bd0a3;
    local_50 = internal::ReadTag(local_50,&local_44,0);
    if (local_50 == (char *)0x0) goto LAB_002bd09a;
    cVar3 = (char)local_44;
    switch(local_44 >> 3) {
    case 1:
      if (cVar3 != '\b') break;
      uVar4 = uVar4 | 1;
      uVar2 = internal::ReadVarint(&local_50);
      this->message_set_wire_format_ = uVar2 != 0;
      goto joined_r0x002bd03d;
    case 2:
      if (cVar3 == '\x10') {
        uVar4 = uVar4 | 2;
        uVar2 = internal::ReadVarint(&local_50);
        this->no_standard_descriptor_accessor_ = uVar2 != 0;
        goto joined_r0x002bd03d;
      }
      break;
    case 3:
      if (cVar3 == '\x18') {
        uVar4 = uVar4 | 4;
        uVar2 = internal::ReadVarint(&local_50);
        this->deprecated_ = uVar2 != 0;
        goto joined_r0x002bd03d;
      }
      break;
    case 4:
    case 5:
    case 6:
      break;
    case 7:
      if (cVar3 == '8') {
        uVar4 = uVar4 | 8;
        uVar2 = internal::ReadVarint(&local_50);
        this->map_entry_ = uVar2 != 0;
        goto joined_r0x002bd03d;
      }
      break;
    default:
      if ((local_44 >> 3 == 999) && (cVar3 == ':')) {
        local_50 = local_50 + -2;
        do {
          local_50 = local_50 + 2;
          msg = RepeatedPtrField<google::protobuf::UninterpretedOption>::Add
                          (&this->uninterpreted_option_);
          local_50 = internal::ParseContext::ParseMessage<google::protobuf::UninterpretedOption>
                               (ctx,msg,local_50);
          if (local_50 == (char *)0x0) goto LAB_002bd09a;
        } while ((local_50 < (ctx->super_EpsCopyInputStream).limit_end_) &&
                (bVar1 = internal::ExpectTag<7994u>(local_50), bVar1));
        goto LAB_002bcf14;
      }
    }
    if (((ulong)local_44 == 0) || ((local_44 & 7) == 4)) {
      (ctx->super_EpsCopyInputStream).last_tag_minus_1_ = local_44 - 1;
      goto LAB_002bd0a3;
    }
    if (local_44 < 8000) {
      local_50 = internal::UnknownFieldParse(local_44,local_40,local_50,ctx);
    }
    else {
      local_50 = internal::ExtensionSet::ParseField
                           (local_38,(ulong)local_44,local_50,
                            (Message *)_MessageOptions_default_instance_,local_40,ctx);
    }
joined_r0x002bd03d:
    if (local_50 == (char *)0x0) {
LAB_002bd09a:
      local_50 = (char *)0x0;
LAB_002bd0a3:
      (this->_has_bits_).has_bits_[0] = (this->_has_bits_).has_bits_[0] | uVar4;
      return local_50;
    }
  } while( true );
}

Assistant:

const char* MessageOptions::_InternalParse(const char* ptr, ::PROTOBUF_NAMESPACE_ID::internal::ParseContext* ctx) {
#define CHK_(x) if (PROTOBUF_PREDICT_FALSE(!(x))) goto failure
  _Internal::HasBits has_bits{};
  ::PROTOBUF_NAMESPACE_ID::Arena* arena = GetArenaNoVirtual(); (void)arena;
  while (!ctx->Done(&ptr)) {
    ::PROTOBUF_NAMESPACE_ID::uint32 tag;
    ptr = ::PROTOBUF_NAMESPACE_ID::internal::ReadTag(ptr, &tag);
    CHK_(ptr);
    switch (tag >> 3) {
      // optional bool message_set_wire_format = 1 [default = false];
      case 1:
        if (PROTOBUF_PREDICT_TRUE(static_cast<::PROTOBUF_NAMESPACE_ID::uint8>(tag) == 8)) {
          _Internal::set_has_message_set_wire_format(&has_bits);
          message_set_wire_format_ = ::PROTOBUF_NAMESPACE_ID::internal::ReadVarint(&ptr);
          CHK_(ptr);
        } else goto handle_unusual;
        continue;
      // optional bool no_standard_descriptor_accessor = 2 [default = false];
      case 2:
        if (PROTOBUF_PREDICT_TRUE(static_cast<::PROTOBUF_NAMESPACE_ID::uint8>(tag) == 16)) {
          _Internal::set_has_no_standard_descriptor_accessor(&has_bits);
          no_standard_descriptor_accessor_ = ::PROTOBUF_NAMESPACE_ID::internal::ReadVarint(&ptr);
          CHK_(ptr);
        } else goto handle_unusual;
        continue;
      // optional bool deprecated = 3 [default = false];
      case 3:
        if (PROTOBUF_PREDICT_TRUE(static_cast<::PROTOBUF_NAMESPACE_ID::uint8>(tag) == 24)) {
          _Internal::set_has_deprecated(&has_bits);
          deprecated_ = ::PROTOBUF_NAMESPACE_ID::internal::ReadVarint(&ptr);
          CHK_(ptr);
        } else goto handle_unusual;
        continue;
      // optional bool map_entry = 7;
      case 7:
        if (PROTOBUF_PREDICT_TRUE(static_cast<::PROTOBUF_NAMESPACE_ID::uint8>(tag) == 56)) {
          _Internal::set_has_map_entry(&has_bits);
          map_entry_ = ::PROTOBUF_NAMESPACE_ID::internal::ReadVarint(&ptr);
          CHK_(ptr);
        } else goto handle_unusual;
        continue;
      // repeated .google.protobuf.UninterpretedOption uninterpreted_option = 999;
      case 999:
        if (PROTOBUF_PREDICT_TRUE(static_cast<::PROTOBUF_NAMESPACE_ID::uint8>(tag) == 58)) {
          ptr -= 2;
          do {
            ptr += 2;
            ptr = ctx->ParseMessage(_internal_add_uninterpreted_option(), ptr);
            CHK_(ptr);
            if (!ctx->DataAvailable(ptr)) break;
          } while (::PROTOBUF_NAMESPACE_ID::internal::ExpectTag<7994>(ptr));
        } else goto handle_unusual;
        continue;
      default: {
      handle_unusual:
        if ((tag & 7) == 4 || tag == 0) {
          ctx->SetLastTag(tag);
          goto success;
        }
      if ((8000u <= tag)) {
        ptr = _extensions_.ParseField(tag, ptr,
            internal_default_instance(), &_internal_metadata_, ctx);
        CHK_(ptr != nullptr);
        continue;
      }
        ptr = UnknownFieldParse(tag, &_internal_metadata_, ptr, ctx);
        CHK_(ptr != nullptr);
        continue;
      }
    }  // switch
  }  // while
success:
  _has_bits_.Or(has_bits);
  return ptr;
failure:
  ptr = nullptr;
  goto success;
#undef CHK_
}